

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

dsListEntry * dsListBegin(dsList *list)

{
  dsListEntry *pdVar1;
  
  if (list->headOffset == 0xffffffffffffffff) {
    pdVar1 = (dsListEntry *)0x0;
  }
  else {
    pdVar1 = (dsListEntry *)dsPtr(list->headOffset,0x20);
    if (pdVar1 == (dsListEntry *)0x0) {
      pdVar1 = (dsListEntry *)0x0;
      dsRunLogCallback("%s(): Can\'t map list head.\n","dsListBegin");
    }
  }
  return pdVar1;
}

Assistant:

dsListEntry *
dsListBegin(dsList *list)
{
	dsListEntry *entry;

	if (list->headOffset == UINT64_MAX) {
		return(NULL);
	}

	if ((entry = dsPtr(list->headOffset, sizeof(*entry))) == NULL) {
		dsLog("Can't map list head.\n");
		return(NULL);
	}

	return(entry);
}